

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkImageUtil.cpp
# Opt level: O2

TextureFormat vk::mapVkFormat(VkFormat format)

{
  ulong uVar1;
  InternalError *this;
  ulong uStack_20;
  
  uStack_20 = 5;
  switch(format) {
  case VK_FORMAT_R4G4_UNORM_PACK8:
    uVar1 = 0x700000000;
    break;
  case VK_FORMAT_R4G4B4A4_UNORM_PACK16:
    uStack_20 = 8;
    goto LAB_008a79ea;
  case VK_FORMAT_B4G4R4A4_UNORM_PACK16:
    uStack_20 = 0xb;
LAB_008a79ea:
    uVar1 = 0xa00000000;
    break;
  case VK_FORMAT_R5G6B5_UNORM_PACK16:
    uStack_20 = 7;
    goto LAB_008a79d1;
  case VK_FORMAT_B5G6R5_UNORM_PACK16:
    uStack_20 = 10;
LAB_008a79d1:
    uVar1 = 0x800000000;
    break;
  case VK_FORMAT_R5G5B5A1_UNORM_PACK16:
    uStack_20 = 8;
    goto LAB_008a7a49;
  case VK_FORMAT_B5G5R5A1_UNORM_PACK16:
    uStack_20 = 0xb;
LAB_008a7a49:
    uVar1 = 0xb00000000;
    break;
  case VK_FORMAT_A1R5G5B5_UNORM_PACK16:
    uStack_20 = 9;
    uVar1 = 0xc00000000;
    break;
  case VK_FORMAT_R8_UNORM:
    uVar1 = 0x300000000;
    goto LAB_008a7b0d;
  case VK_FORMAT_R8_SNORM:
    uVar1 = 0;
    goto LAB_008a7b0d;
  case VK_FORMAT_R8_USCALED:
  case VK_FORMAT_R8_UINT:
    uVar1 = 0x1e00000000;
    goto LAB_008a7b0d;
  case VK_FORMAT_R8_SSCALED:
  case VK_FORMAT_R8_SINT:
    uVar1 = 0x1b00000000;
    goto LAB_008a7b0d;
  case VK_FORMAT_R8_SRGB:
    uStack_20 = 0xc;
  case VK_FORMAT_R8G8_UNORM:
    goto switchD_008a77dc_caseD_10;
  case VK_FORMAT_R8G8_SNORM:
    goto switchD_008a77dc_caseD_11;
  case VK_FORMAT_R8G8_USCALED:
  case VK_FORMAT_R8G8_UINT:
    goto switchD_008a77dc_caseD_12;
  case VK_FORMAT_R8G8_SSCALED:
  case VK_FORMAT_R8G8_SINT:
    goto switchD_008a77dc_caseD_13;
  case VK_FORMAT_R8G8_SRGB:
    uStack_20 = 0xd;
    goto switchD_008a77dc_caseD_10;
  case VK_FORMAT_R8G8B8_UNORM:
    uStack_20 = 7;
    goto switchD_008a77dc_caseD_10;
  case VK_FORMAT_R8G8B8_SNORM:
    uStack_20 = 7;
    goto switchD_008a77dc_caseD_11;
  case VK_FORMAT_R8G8B8_USCALED:
  case VK_FORMAT_R8G8B8_UINT:
    uStack_20 = 7;
    goto switchD_008a77dc_caseD_12;
  case VK_FORMAT_R8G8B8_SSCALED:
  case VK_FORMAT_R8G8B8_SINT:
    uStack_20 = 7;
    goto switchD_008a77dc_caseD_13;
  case VK_FORMAT_R8G8B8_SRGB:
    uStack_20 = 0xe;
    goto switchD_008a77dc_caseD_10;
  case VK_FORMAT_B8G8R8_UNORM:
    uStack_20 = 10;
    goto switchD_008a77dc_caseD_10;
  case VK_FORMAT_B8G8R8_SNORM:
    uStack_20 = 10;
    goto switchD_008a77dc_caseD_11;
  case VK_FORMAT_B8G8R8_USCALED:
  case VK_FORMAT_B8G8R8_UINT:
    uStack_20 = 10;
    goto switchD_008a77dc_caseD_12;
  case VK_FORMAT_B8G8R8_SSCALED:
  case VK_FORMAT_B8G8R8_SINT:
    uStack_20 = 10;
    goto switchD_008a77dc_caseD_13;
  case VK_FORMAT_B8G8R8_SRGB:
    uStack_20 = 0x10;
    goto switchD_008a77dc_caseD_10;
  case VK_FORMAT_R8G8B8A8_UNORM:
  case VK_FORMAT_A8B8G8R8_UNORM_PACK32:
    uStack_20 = 8;
    goto switchD_008a77dc_caseD_10;
  case VK_FORMAT_R8G8B8A8_SNORM:
  case VK_FORMAT_A8B8G8R8_SNORM_PACK32:
    uStack_20 = 8;
    goto switchD_008a77dc_caseD_11;
  case VK_FORMAT_R8G8B8A8_USCALED:
  case VK_FORMAT_R8G8B8A8_UINT:
  case VK_FORMAT_A8B8G8R8_USCALED_PACK32:
  case VK_FORMAT_A8B8G8R8_UINT_PACK32:
    uStack_20 = 8;
    goto switchD_008a77dc_caseD_12;
  case VK_FORMAT_R8G8B8A8_SSCALED:
  case VK_FORMAT_R8G8B8A8_SINT:
  case VK_FORMAT_A8B8G8R8_SSCALED_PACK32:
  case VK_FORMAT_A8B8G8R8_SINT_PACK32:
    uStack_20 = 8;
    goto switchD_008a77dc_caseD_13;
  case VK_FORMAT_R8G8B8A8_SRGB:
  case VK_FORMAT_A8B8G8R8_SRGB_PACK32:
    uStack_20 = 0xf;
    goto switchD_008a77dc_caseD_10;
  case VK_FORMAT_B8G8R8A8_UNORM:
    uStack_20 = 0xb;
    goto switchD_008a77dc_caseD_10;
  case VK_FORMAT_B8G8R8A8_SNORM:
    uStack_20 = 0xb;
switchD_008a77dc_caseD_11:
    uVar1 = 0;
    break;
  case VK_FORMAT_B8G8R8A8_USCALED:
  case VK_FORMAT_B8G8R8A8_UINT:
    uStack_20 = 0xb;
    goto switchD_008a77dc_caseD_12;
  case VK_FORMAT_B8G8R8A8_SSCALED:
  case VK_FORMAT_B8G8R8A8_SINT:
    uStack_20 = 0xb;
switchD_008a77dc_caseD_13:
    uVar1 = 0x1b00000000;
    break;
  case VK_FORMAT_B8G8R8A8_SRGB:
    uStack_20 = 0x11;
switchD_008a77dc_caseD_10:
    uVar1 = 0x300000000;
    break;
  case VK_FORMAT_A2R10G10B10_UNORM_PACK32:
    uStack_20 = 0xb;
    goto LAB_008a7980;
  case VK_FORMAT_A2R10G10B10_SNORM_PACK32:
    uStack_20 = 0xb;
    goto LAB_008a793f;
  case VK_FORMAT_A2R10G10B10_USCALED_PACK32:
  case VK_FORMAT_A2R10G10B10_UINT_PACK32:
    uStack_20 = 0xb;
    goto LAB_008a7890;
  case VK_FORMAT_A2R10G10B10_SSCALED_PACK32:
  case VK_FORMAT_A2R10G10B10_SINT_PACK32:
    uStack_20 = 0xb;
    goto LAB_008a78a2;
  case VK_FORMAT_A2B10G10R10_UNORM_PACK32:
    uStack_20 = 8;
LAB_008a7980:
    uVar1 = 0xf00000000;
    break;
  case VK_FORMAT_A2B10G10R10_SNORM_PACK32:
    uStack_20 = 8;
LAB_008a793f:
    uVar1 = 0xe00000000;
    break;
  case VK_FORMAT_A2B10G10R10_USCALED_PACK32:
  case VK_FORMAT_A2B10G10R10_UINT_PACK32:
    uStack_20 = 8;
LAB_008a7890:
    uVar1 = 0x1500000000;
    break;
  case VK_FORMAT_A2B10G10R10_SSCALED_PACK32:
  case VK_FORMAT_A2B10G10R10_SINT_PACK32:
    uStack_20 = 8;
LAB_008a78a2:
    uVar1 = 0x1400000000;
    break;
  case VK_FORMAT_R16_UNORM:
    uVar1 = 0x400000000;
    goto LAB_008a7b0d;
  case VK_FORMAT_R16_SNORM:
    uVar1 = 0x100000000;
    goto LAB_008a7b0d;
  case VK_FORMAT_R16_USCALED:
  case VK_FORMAT_R16_UINT:
    uVar1 = 0x1f00000000;
    goto LAB_008a7b0d;
  case VK_FORMAT_R16_SSCALED:
  case VK_FORMAT_R16_SINT:
    uVar1 = 0x1c00000000;
    goto LAB_008a7b0d;
  case VK_FORMAT_R16_SFLOAT:
    uVar1 = 0x2200000000;
    goto LAB_008a7b0d;
  case VK_FORMAT_R16G16_UNORM:
    goto switchD_008a77dc_caseD_4d;
  case VK_FORMAT_R16G16_SNORM:
    goto switchD_008a77dc_caseD_4e;
  case VK_FORMAT_R16G16_USCALED:
  case VK_FORMAT_R16G16_UINT:
    goto switchD_008a77dc_caseD_4f;
  case VK_FORMAT_R16G16_SSCALED:
  case VK_FORMAT_R16G16_SINT:
    goto switchD_008a77dc_caseD_50;
  case VK_FORMAT_R16G16_SFLOAT:
    goto switchD_008a77dc_caseD_53;
  case VK_FORMAT_R16G16B16_UNORM:
    uStack_20 = 7;
    goto switchD_008a77dc_caseD_4d;
  case VK_FORMAT_R16G16B16_SNORM:
    uStack_20 = 7;
    goto switchD_008a77dc_caseD_4e;
  case VK_FORMAT_R16G16B16_USCALED:
  case VK_FORMAT_R16G16B16_UINT:
    uStack_20 = 7;
    goto switchD_008a77dc_caseD_4f;
  case VK_FORMAT_R16G16B16_SSCALED:
  case VK_FORMAT_R16G16B16_SINT:
    uStack_20 = 7;
    goto switchD_008a77dc_caseD_50;
  case VK_FORMAT_R16G16B16_SFLOAT:
    uStack_20 = 7;
    goto switchD_008a77dc_caseD_53;
  case VK_FORMAT_R16G16B16A16_UNORM:
    uStack_20 = 8;
    goto switchD_008a77dc_caseD_4d;
  case VK_FORMAT_R16G16B16A16_SNORM:
    uStack_20 = 8;
switchD_008a77dc_caseD_4e:
    uVar1 = 0x100000000;
    break;
  case VK_FORMAT_R16G16B16A16_USCALED:
  case VK_FORMAT_R16G16B16A16_UINT:
    uStack_20 = 8;
switchD_008a77dc_caseD_4f:
    uVar1 = 0x1f00000000;
    break;
  case VK_FORMAT_R16G16B16A16_SSCALED:
  case VK_FORMAT_R16G16B16A16_SINT:
    uStack_20 = 8;
switchD_008a77dc_caseD_50:
    uVar1 = 0x1c00000000;
    break;
  case VK_FORMAT_R16G16B16A16_SFLOAT:
    uStack_20 = 8;
switchD_008a77dc_caseD_53:
    uVar1 = 0x2200000000;
    break;
  case VK_FORMAT_R32_UINT:
    uVar1 = 0x2100000000;
    goto LAB_008a7b0d;
  case VK_FORMAT_R32_SINT:
    uVar1 = 0x1d00000000;
    goto LAB_008a7b0d;
  case VK_FORMAT_R32_SFLOAT:
    uVar1 = 0x2300000000;
    goto LAB_008a7b0d;
  case VK_FORMAT_R32G32_UINT:
    goto switchD_008a77dc_caseD_65;
  case VK_FORMAT_R32G32_SINT:
    goto switchD_008a77dc_caseD_66;
  case VK_FORMAT_R32G32_SFLOAT:
    goto switchD_008a77dc_caseD_67;
  case VK_FORMAT_R32G32B32_UINT:
    uStack_20 = 7;
    goto switchD_008a77dc_caseD_65;
  case VK_FORMAT_R32G32B32_SINT:
    uStack_20 = 7;
    goto switchD_008a77dc_caseD_66;
  case VK_FORMAT_R32G32B32_SFLOAT:
    uStack_20 = 7;
    goto switchD_008a77dc_caseD_67;
  case VK_FORMAT_R32G32B32A32_UINT:
    uStack_20 = 8;
switchD_008a77dc_caseD_65:
    uVar1 = 0x2100000000;
    break;
  case VK_FORMAT_R32G32B32A32_SINT:
    uStack_20 = 8;
switchD_008a77dc_caseD_66:
    uVar1 = 0x1d00000000;
    break;
  case VK_FORMAT_R32G32B32A32_SFLOAT:
    uStack_20 = 8;
    goto switchD_008a77dc_caseD_67;
  default:
    this = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this,"Unknown image format",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkImageUtil.cpp"
               ,0x22d);
    __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
  case VK_FORMAT_R64_SFLOAT:
    uVar1 = 0x2400000000;
LAB_008a7b0d:
    uStack_20 = 0;
    break;
  case VK_FORMAT_R64G64_SFLOAT:
    goto switchD_008a77dc_caseD_73;
  case VK_FORMAT_R64G64B64_SFLOAT:
    uStack_20 = 7;
    goto switchD_008a77dc_caseD_73;
  case VK_FORMAT_R64G64B64A64_SFLOAT:
    uStack_20 = 8;
switchD_008a77dc_caseD_73:
    uVar1 = 0x2400000000;
    break;
  case VK_FORMAT_B10G11R11_UFLOAT_PACK32:
    uStack_20 = 7;
    uVar1 = 0x1600000000;
    break;
  case VK_FORMAT_E5B9G9R9_UFLOAT_PACK32:
    uStack_20 = 7;
    uVar1 = 0x1700000000;
    break;
  case VK_FORMAT_D16_UNORM:
    uStack_20 = 0x12;
switchD_008a77dc_caseD_4d:
    uVar1 = 0x400000000;
    break;
  case VK_FORMAT_X8_D24_UNORM_PACK32:
    uStack_20 = 0x12;
    goto LAB_008a7a63;
  case VK_FORMAT_D32_SFLOAT:
    uStack_20 = 0x12;
switchD_008a77dc_caseD_67:
    uVar1 = 0x2300000000;
    break;
  case VK_FORMAT_S8_UINT:
    uStack_20 = 0x13;
switchD_008a77dc_caseD_12:
    uVar1 = 0x1e00000000;
    break;
  case VK_FORMAT_D16_UNORM_S8_UINT:
    uStack_20 = 0x14;
    uVar1 = 0x1800000000;
    break;
  case VK_FORMAT_D24_UNORM_S8_UINT:
    uStack_20 = 0x14;
LAB_008a7a63:
    uVar1 = 0x1a00000000;
    break;
  case VK_FORMAT_D32_SFLOAT_S8_UINT:
    uStack_20 = 0x14;
    uVar1 = 0x2500000000;
  }
  return (TextureFormat)(uVar1 | uStack_20);
}

Assistant:

tcu::TextureFormat mapVkFormat (VkFormat format)
{
	using tcu::TextureFormat;

	// update this mapping if VkFormat changes
	DE_STATIC_ASSERT(VK_CORE_FORMAT_LAST == 185);

	switch (format)
	{
		case VK_FORMAT_R4G4_UNORM_PACK8:		return TextureFormat(TextureFormat::RG,		TextureFormat::UNORM_BYTE_44);
		case VK_FORMAT_R5G6B5_UNORM_PACK16:		return TextureFormat(TextureFormat::RGB,	TextureFormat::UNORM_SHORT_565);
		case VK_FORMAT_R4G4B4A4_UNORM_PACK16:	return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNORM_SHORT_4444);
		case VK_FORMAT_R5G5B5A1_UNORM_PACK16:	return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNORM_SHORT_5551);

		case VK_FORMAT_B5G6R5_UNORM_PACK16:		return TextureFormat(TextureFormat::BGR,	TextureFormat::UNORM_SHORT_565);
		case VK_FORMAT_B4G4R4A4_UNORM_PACK16:	return TextureFormat(TextureFormat::BGRA,	TextureFormat::UNORM_SHORT_4444);
		case VK_FORMAT_B5G5R5A1_UNORM_PACK16:	return TextureFormat(TextureFormat::BGRA,	TextureFormat::UNORM_SHORT_5551);

		case VK_FORMAT_A1R5G5B5_UNORM_PACK16:	return TextureFormat(TextureFormat::ARGB,	TextureFormat::UNORM_SHORT_1555);

		case VK_FORMAT_R8_UNORM:				return TextureFormat(TextureFormat::R,		TextureFormat::UNORM_INT8);
		case VK_FORMAT_R8_SNORM:				return TextureFormat(TextureFormat::R,		TextureFormat::SNORM_INT8);
		case VK_FORMAT_R8_USCALED:				return TextureFormat(TextureFormat::R,		TextureFormat::UNSIGNED_INT8);
		case VK_FORMAT_R8_SSCALED:				return TextureFormat(TextureFormat::R,		TextureFormat::SIGNED_INT8);
		case VK_FORMAT_R8_UINT:					return TextureFormat(TextureFormat::R,		TextureFormat::UNSIGNED_INT8);
		case VK_FORMAT_R8_SINT:					return TextureFormat(TextureFormat::R,		TextureFormat::SIGNED_INT8);
		case VK_FORMAT_R8_SRGB:					return TextureFormat(TextureFormat::sR,		TextureFormat::UNORM_INT8);

		case VK_FORMAT_R8G8_UNORM:				return TextureFormat(TextureFormat::RG,		TextureFormat::UNORM_INT8);
		case VK_FORMAT_R8G8_SNORM:				return TextureFormat(TextureFormat::RG,		TextureFormat::SNORM_INT8);
		case VK_FORMAT_R8G8_USCALED:			return TextureFormat(TextureFormat::RG,		TextureFormat::UNSIGNED_INT8);
		case VK_FORMAT_R8G8_SSCALED:			return TextureFormat(TextureFormat::RG,		TextureFormat::SIGNED_INT8);
		case VK_FORMAT_R8G8_UINT:				return TextureFormat(TextureFormat::RG,		TextureFormat::UNSIGNED_INT8);
		case VK_FORMAT_R8G8_SINT:				return TextureFormat(TextureFormat::RG,		TextureFormat::SIGNED_INT8);
		case VK_FORMAT_R8G8_SRGB:				return TextureFormat(TextureFormat::sRG,	TextureFormat::UNORM_INT8);

		case VK_FORMAT_R8G8B8_UNORM:			return TextureFormat(TextureFormat::RGB,	TextureFormat::UNORM_INT8);
		case VK_FORMAT_R8G8B8_SNORM:			return TextureFormat(TextureFormat::RGB,	TextureFormat::SNORM_INT8);
		case VK_FORMAT_R8G8B8_USCALED:			return TextureFormat(TextureFormat::RGB,	TextureFormat::UNSIGNED_INT8);
		case VK_FORMAT_R8G8B8_SSCALED:			return TextureFormat(TextureFormat::RGB,	TextureFormat::SIGNED_INT8);
		case VK_FORMAT_R8G8B8_UINT:				return TextureFormat(TextureFormat::RGB,	TextureFormat::UNSIGNED_INT8);
		case VK_FORMAT_R8G8B8_SINT:				return TextureFormat(TextureFormat::RGB,	TextureFormat::SIGNED_INT8);
		case VK_FORMAT_R8G8B8_SRGB:				return TextureFormat(TextureFormat::sRGB,	TextureFormat::UNORM_INT8);

		case VK_FORMAT_R8G8B8A8_UNORM:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNORM_INT8);
		case VK_FORMAT_R8G8B8A8_SNORM:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::SNORM_INT8);
		case VK_FORMAT_R8G8B8A8_USCALED:		return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNSIGNED_INT8);
		case VK_FORMAT_R8G8B8A8_SSCALED:		return TextureFormat(TextureFormat::RGBA,	TextureFormat::SIGNED_INT8);
		case VK_FORMAT_R8G8B8A8_UINT:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNSIGNED_INT8);
		case VK_FORMAT_R8G8B8A8_SINT:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::SIGNED_INT8);
		case VK_FORMAT_R8G8B8A8_SRGB:			return TextureFormat(TextureFormat::sRGBA,	TextureFormat::UNORM_INT8);

		case VK_FORMAT_R16_UNORM:				return TextureFormat(TextureFormat::R,		TextureFormat::UNORM_INT16);
		case VK_FORMAT_R16_SNORM:				return TextureFormat(TextureFormat::R,		TextureFormat::SNORM_INT16);
		case VK_FORMAT_R16_USCALED:				return TextureFormat(TextureFormat::R,		TextureFormat::UNSIGNED_INT16);
		case VK_FORMAT_R16_SSCALED:				return TextureFormat(TextureFormat::R,		TextureFormat::SIGNED_INT16);
		case VK_FORMAT_R16_UINT:				return TextureFormat(TextureFormat::R,		TextureFormat::UNSIGNED_INT16);
		case VK_FORMAT_R16_SINT:				return TextureFormat(TextureFormat::R,		TextureFormat::SIGNED_INT16);
		case VK_FORMAT_R16_SFLOAT:				return TextureFormat(TextureFormat::R,		TextureFormat::HALF_FLOAT);

		case VK_FORMAT_R16G16_UNORM:			return TextureFormat(TextureFormat::RG,		TextureFormat::UNORM_INT16);
		case VK_FORMAT_R16G16_SNORM:			return TextureFormat(TextureFormat::RG,		TextureFormat::SNORM_INT16);
		case VK_FORMAT_R16G16_USCALED:			return TextureFormat(TextureFormat::RG,		TextureFormat::UNSIGNED_INT16);
		case VK_FORMAT_R16G16_SSCALED:			return TextureFormat(TextureFormat::RG,		TextureFormat::SIGNED_INT16);
		case VK_FORMAT_R16G16_UINT:				return TextureFormat(TextureFormat::RG,		TextureFormat::UNSIGNED_INT16);
		case VK_FORMAT_R16G16_SINT:				return TextureFormat(TextureFormat::RG,		TextureFormat::SIGNED_INT16);
		case VK_FORMAT_R16G16_SFLOAT:			return TextureFormat(TextureFormat::RG,		TextureFormat::HALF_FLOAT);

		case VK_FORMAT_R16G16B16_UNORM:			return TextureFormat(TextureFormat::RGB,	TextureFormat::UNORM_INT16);
		case VK_FORMAT_R16G16B16_SNORM:			return TextureFormat(TextureFormat::RGB,	TextureFormat::SNORM_INT16);
		case VK_FORMAT_R16G16B16_USCALED:		return TextureFormat(TextureFormat::RGB,	TextureFormat::UNSIGNED_INT16);
		case VK_FORMAT_R16G16B16_SSCALED:		return TextureFormat(TextureFormat::RGB,	TextureFormat::SIGNED_INT16);
		case VK_FORMAT_R16G16B16_UINT:			return TextureFormat(TextureFormat::RGB,	TextureFormat::UNSIGNED_INT16);
		case VK_FORMAT_R16G16B16_SINT:			return TextureFormat(TextureFormat::RGB,	TextureFormat::SIGNED_INT16);
		case VK_FORMAT_R16G16B16_SFLOAT:		return TextureFormat(TextureFormat::RGB,	TextureFormat::HALF_FLOAT);

		case VK_FORMAT_R16G16B16A16_UNORM:		return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNORM_INT16);
		case VK_FORMAT_R16G16B16A16_SNORM:		return TextureFormat(TextureFormat::RGBA,	TextureFormat::SNORM_INT16);
		case VK_FORMAT_R16G16B16A16_USCALED:	return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNSIGNED_INT16);
		case VK_FORMAT_R16G16B16A16_SSCALED:	return TextureFormat(TextureFormat::RGBA,	TextureFormat::SIGNED_INT16);
		case VK_FORMAT_R16G16B16A16_UINT:		return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNSIGNED_INT16);
		case VK_FORMAT_R16G16B16A16_SINT:		return TextureFormat(TextureFormat::RGBA,	TextureFormat::SIGNED_INT16);
		case VK_FORMAT_R16G16B16A16_SFLOAT:		return TextureFormat(TextureFormat::RGBA,	TextureFormat::HALF_FLOAT);

		case VK_FORMAT_R32_UINT:				return TextureFormat(TextureFormat::R,		TextureFormat::UNSIGNED_INT32);
		case VK_FORMAT_R32_SINT:				return TextureFormat(TextureFormat::R,		TextureFormat::SIGNED_INT32);
		case VK_FORMAT_R32_SFLOAT:				return TextureFormat(TextureFormat::R,		TextureFormat::FLOAT);

		case VK_FORMAT_R32G32_UINT:				return TextureFormat(TextureFormat::RG,		TextureFormat::UNSIGNED_INT32);
		case VK_FORMAT_R32G32_SINT:				return TextureFormat(TextureFormat::RG,		TextureFormat::SIGNED_INT32);
		case VK_FORMAT_R32G32_SFLOAT:			return TextureFormat(TextureFormat::RG,		TextureFormat::FLOAT);

		case VK_FORMAT_R32G32B32_UINT:			return TextureFormat(TextureFormat::RGB,	TextureFormat::UNSIGNED_INT32);
		case VK_FORMAT_R32G32B32_SINT:			return TextureFormat(TextureFormat::RGB,	TextureFormat::SIGNED_INT32);
		case VK_FORMAT_R32G32B32_SFLOAT:		return TextureFormat(TextureFormat::RGB,	TextureFormat::FLOAT);

		case VK_FORMAT_R32G32B32A32_UINT:		return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNSIGNED_INT32);
		case VK_FORMAT_R32G32B32A32_SINT:		return TextureFormat(TextureFormat::RGBA,	TextureFormat::SIGNED_INT32);
		case VK_FORMAT_R32G32B32A32_SFLOAT:		return TextureFormat(TextureFormat::RGBA,	TextureFormat::FLOAT);

		case VK_FORMAT_R64_SFLOAT:				return TextureFormat(TextureFormat::R,		TextureFormat::FLOAT64);
		case VK_FORMAT_R64G64_SFLOAT:			return TextureFormat(TextureFormat::RG,		TextureFormat::FLOAT64);
		case VK_FORMAT_R64G64B64_SFLOAT:		return TextureFormat(TextureFormat::RGB,	TextureFormat::FLOAT64);
		case VK_FORMAT_R64G64B64A64_SFLOAT:		return TextureFormat(TextureFormat::RGBA,	TextureFormat::FLOAT64);

		case VK_FORMAT_B10G11R11_UFLOAT_PACK32:	return TextureFormat(TextureFormat::RGB,	TextureFormat::UNSIGNED_INT_11F_11F_10F_REV);
		case VK_FORMAT_E5B9G9R9_UFLOAT_PACK32:	return TextureFormat(TextureFormat::RGB,	TextureFormat::UNSIGNED_INT_999_E5_REV);

		case VK_FORMAT_B8G8R8_UNORM:			return TextureFormat(TextureFormat::BGR,	TextureFormat::UNORM_INT8);
		case VK_FORMAT_B8G8R8_SNORM:			return TextureFormat(TextureFormat::BGR,	TextureFormat::SNORM_INT8);
		case VK_FORMAT_B8G8R8_USCALED:			return TextureFormat(TextureFormat::BGR,	TextureFormat::UNSIGNED_INT8);
		case VK_FORMAT_B8G8R8_SSCALED:			return TextureFormat(TextureFormat::BGR,	TextureFormat::SIGNED_INT8);
		case VK_FORMAT_B8G8R8_UINT:				return TextureFormat(TextureFormat::BGR,	TextureFormat::UNSIGNED_INT8);
		case VK_FORMAT_B8G8R8_SINT:				return TextureFormat(TextureFormat::BGR,	TextureFormat::SIGNED_INT8);
		case VK_FORMAT_B8G8R8_SRGB:				return TextureFormat(TextureFormat::sBGR,	TextureFormat::UNORM_INT8);

		case VK_FORMAT_B8G8R8A8_UNORM:			return TextureFormat(TextureFormat::BGRA,	TextureFormat::UNORM_INT8);
		case VK_FORMAT_B8G8R8A8_SNORM:			return TextureFormat(TextureFormat::BGRA,	TextureFormat::SNORM_INT8);
		case VK_FORMAT_B8G8R8A8_USCALED:		return TextureFormat(TextureFormat::BGRA,	TextureFormat::UNSIGNED_INT8);
		case VK_FORMAT_B8G8R8A8_SSCALED:		return TextureFormat(TextureFormat::BGRA,	TextureFormat::SIGNED_INT8);
		case VK_FORMAT_B8G8R8A8_UINT:			return TextureFormat(TextureFormat::BGRA,	TextureFormat::UNSIGNED_INT8);
		case VK_FORMAT_B8G8R8A8_SINT:			return TextureFormat(TextureFormat::BGRA,	TextureFormat::SIGNED_INT8);
		case VK_FORMAT_B8G8R8A8_SRGB:			return TextureFormat(TextureFormat::sBGRA,	TextureFormat::UNORM_INT8);

		case VK_FORMAT_D16_UNORM:				return TextureFormat(TextureFormat::D,		TextureFormat::UNORM_INT16);
		case VK_FORMAT_X8_D24_UNORM_PACK32:		return TextureFormat(TextureFormat::D,		TextureFormat::UNSIGNED_INT_24_8_REV);
		case VK_FORMAT_D32_SFLOAT:				return TextureFormat(TextureFormat::D,		TextureFormat::FLOAT);

		case VK_FORMAT_S8_UINT:					return TextureFormat(TextureFormat::S,		TextureFormat::UNSIGNED_INT8);

		// \note There is no standard interleaved memory layout for DS formats; buffer-image copies
		//		 will always operate on either D or S aspect only. See Khronos bug 12998
		case VK_FORMAT_D16_UNORM_S8_UINT:		return TextureFormat(TextureFormat::DS,		TextureFormat::UNSIGNED_INT_16_8_8);
		case VK_FORMAT_D24_UNORM_S8_UINT:		return TextureFormat(TextureFormat::DS,		TextureFormat::UNSIGNED_INT_24_8_REV);
		case VK_FORMAT_D32_SFLOAT_S8_UINT:		return TextureFormat(TextureFormat::DS,		TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV);

#if (DE_ENDIANNESS == DE_LITTLE_ENDIAN)
		case VK_FORMAT_A8B8G8R8_UNORM_PACK32:	return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNORM_INT8);
		case VK_FORMAT_A8B8G8R8_SNORM_PACK32:	return TextureFormat(TextureFormat::RGBA,	TextureFormat::SNORM_INT8);
		case VK_FORMAT_A8B8G8R8_USCALED_PACK32:	return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNSIGNED_INT8);
		case VK_FORMAT_A8B8G8R8_SSCALED_PACK32:	return TextureFormat(TextureFormat::RGBA,	TextureFormat::SIGNED_INT8);
		case VK_FORMAT_A8B8G8R8_UINT_PACK32:	return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNSIGNED_INT8);
		case VK_FORMAT_A8B8G8R8_SINT_PACK32:	return TextureFormat(TextureFormat::RGBA,	TextureFormat::SIGNED_INT8);
		case VK_FORMAT_A8B8G8R8_SRGB_PACK32:	return TextureFormat(TextureFormat::sRGBA,	TextureFormat::UNORM_INT8);
#else
#	error "Big-endian not supported"
#endif

		case VK_FORMAT_A2R10G10B10_UNORM_PACK32:	return TextureFormat(TextureFormat::BGRA,	TextureFormat::UNORM_INT_1010102_REV);
		case VK_FORMAT_A2R10G10B10_SNORM_PACK32:	return TextureFormat(TextureFormat::BGRA,	TextureFormat::SNORM_INT_1010102_REV);
		case VK_FORMAT_A2R10G10B10_USCALED_PACK32:	return TextureFormat(TextureFormat::BGRA,	TextureFormat::UNSIGNED_INT_1010102_REV);
		case VK_FORMAT_A2R10G10B10_SSCALED_PACK32:	return TextureFormat(TextureFormat::BGRA,	TextureFormat::SIGNED_INT_1010102_REV);
		case VK_FORMAT_A2R10G10B10_UINT_PACK32:		return TextureFormat(TextureFormat::BGRA,	TextureFormat::UNSIGNED_INT_1010102_REV);
		case VK_FORMAT_A2R10G10B10_SINT_PACK32:		return TextureFormat(TextureFormat::BGRA,	TextureFormat::SIGNED_INT_1010102_REV);

		case VK_FORMAT_A2B10G10R10_UNORM_PACK32:	return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNORM_INT_1010102_REV);
		case VK_FORMAT_A2B10G10R10_SNORM_PACK32:	return TextureFormat(TextureFormat::RGBA,	TextureFormat::SNORM_INT_1010102_REV);
		case VK_FORMAT_A2B10G10R10_USCALED_PACK32:	return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNSIGNED_INT_1010102_REV);
		case VK_FORMAT_A2B10G10R10_SSCALED_PACK32:	return TextureFormat(TextureFormat::RGBA,	TextureFormat::SIGNED_INT_1010102_REV);
		case VK_FORMAT_A2B10G10R10_UINT_PACK32:		return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNSIGNED_INT_1010102_REV);
		case VK_FORMAT_A2B10G10R10_SINT_PACK32:		return TextureFormat(TextureFormat::RGBA,	TextureFormat::SIGNED_INT_1010102_REV);

		default:
			TCU_THROW(InternalError, "Unknown image format");
	}
}